

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>,std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *lhs,
          unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *rhs)

{
  unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *value;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_60;
  string local_40;
  
  PrintToString<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
            (&local_40,(testing *)lhs,
             (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )rhs_expression);
  PrintToString<std::unordered_set<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
            (&local_60,(testing *)rhs,value);
  testing::internal::EqFailure
            ((char *)this,lhs_expression,(string *)rhs_expression,(string *)&local_40,
             SUB81(&local_60,0));
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}